

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

void __thiscall LexicalAnalyzer::Parse(LexicalAnalyzer *this)

{
  uint uVar1;
  byte bVar2;
  pointer pbVar3;
  pointer pcVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  string word;
  
  uVar9 = 0;
  do {
    pbVar3 = (this->lines).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->lines).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar9) {
      return;
    }
    word._M_dataplus._M_p = (pointer)&word.field_2;
    word._M_string_length = 0;
    word.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)pbVar3 + (char)uVar9 * ' ');
    iVar7 = 0;
    while( true ) {
      uVar8 = (ulong)iVar7;
      pbVar3 = (this->lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar3[uVar9]._M_string_length <= uVar8) break;
      pcVar4 = pbVar3[uVar9]._M_dataplus._M_p;
      bVar2 = pcVar4[uVar8];
      if ((int)(char)bVar2 - 0x30U < 10) {
LAB_00105a60:
        std::__cxx11::string::push_back((char)&word);
      }
      else {
        iVar5 = isalpha((int)(char)bVar2);
        if (iVar5 != 0) goto LAB_00105a60;
        uVar1 = bVar2 - 0x21;
        uVar6 = (ulong)uVar1;
        iVar5 = (int)uVar9;
        if (uVar1 < 0x3f) {
          if ((0x38000001UL >> (uVar6 & 0x3f) & 1) == 0) {
            if ((0x1400UL >> (uVar6 & 0x3f) & 1) == 0) {
              if ((0x4000000000002000U >> (uVar6 & 0x3f) & 1) == 0) goto LAB_00105aa7;
            }
            else if ((byte)(pcVar4[uVar8 - 1] | 0x20U) != 0x65) {
              AddWord(this,&word,iVar5);
              std::__cxx11::string::push_back((char)&word);
              goto LAB_00105b7c;
            }
            goto LAB_00105a60;
          }
          if ((bVar2 == 0x21 || ((bVar2 & 0xfe) == 0x3c || bVar2 == 0x3e)) &&
             (pcVar4[uVar8 + 1] == '=')) {
            AddWord(this,&word,iVar5);
            std::__cxx11::string::push_back((char)&word);
            std::__cxx11::string::push_back((char)&word);
            AddWord(this,&word,iVar5);
            iVar7 = iVar7 + 1;
          }
          else {
            AddWord(this,&word,iVar5);
            std::__cxx11::string::push_back((char)&word);
            AddWord(this,&word,iVar5);
          }
        }
        else {
LAB_00105aa7:
          AddWord(this,&word,iVar5);
          if ((bVar2 != 9) && (bVar2 != 0x20)) {
            std::__cxx11::string::push_back((char)&word);
LAB_00105b7c:
            AddWord(this,&word,iVar5);
          }
        }
      }
      iVar7 = iVar7 + 1;
    }
    std::__cxx11::string::~string((string *)&word);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void LexicalAnalyzer::Parse() {
    for (int i = 0; i < lines.size(); i++) {
        std::string word;
        lines[i] += ' ';//temporary space
        for (int j = 0; j < lines[i].size(); j++) {
            char ch = lines[i][j];
            if (isdigit(ch) || isalpha(ch) || ch == '_' || ch == '.') {//digit,alpha,underline
                word += ch;
            } else if (ch == '-' || ch == '+') {
                //operator - or minus ?
                if (lines[i][j - 1] == 'e' || lines[i][j - 1] == 'E') {
                    word += ch;
                } else {
                    AddWord(word, i);
                    word += ch;
                    AddWord(word, i);
                }
            } else if (ch == '=' || ch == '<' || ch == '>' || ch == '!') {
                char peek = lines[i][j + 1];
                if ((ch == '=' && peek == '=') || (ch == '<' && peek == '=') || (ch == '>' && peek == '=') ||
                    (ch == '!' && peek == '=')) {
                    AddWord(word, i);
                    word += ch;
                    word += peek;
                    AddWord(word, i);
                    ++j;
                } else {
                    AddWord(word, i);
                    word += ch;
                    AddWord(word, i);
                }
            } else {//others
                AddWord(word, i);
                if (ch == ' ' || ch == '\t') continue;
                word += ch;
                AddWord(word, i);
            }
        }
    }
}